

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O0

void __thiscall wasm::LocalGraphFlower::prepareLaziness(LocalGraphFlower *this)

{
  bool bVar1;
  size_t __new_size;
  ulong uVar2;
  size_type sVar3;
  const_reference ppEVar4;
  mapped_type *this_00;
  reference this_01;
  reference this_02;
  LocalSet *local_70;
  LocalSet *set;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> local_60;
  LocalGet *local_50;
  LocalGet *get;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvStack_40;
  Index i;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *actions;
  FlowBlock *block;
  iterator __end2;
  iterator __begin2;
  vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
  *__range2;
  size_t numLocals;
  LocalGraphFlower *this_local;
  
  prepareFlowBlocks(this);
  __new_size = Function::getNumLocals(this->func);
  std::
  vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
  ::resize(&this->getsByIndex,__new_size);
  std::
  vector<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
  ::resize(&this->setsByIndex,__new_size);
  __end2 = std::
           vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
           ::begin(&this->flowBlocks);
  block = (FlowBlock *)
          std::
          vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
          ::end(&this->flowBlocks);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::LocalGraphFlower::FlowBlock_*,_std::vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>_>
                                     *)&block), bVar1) {
    actions = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
              __gnu_cxx::
              __normal_iterator<wasm::LocalGraphFlower::FlowBlock_*,_std::vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>_>
              ::operator*(&__end2);
    pvStack_40 = &((reference)actions)->actions;
    for (get._4_4_ = 0; uVar2 = (ulong)get._4_4_,
        sVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                          (pvStack_40), uVar2 < sVar3; get._4_4_ = get._4_4_ + 1) {
      ppEVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                          (pvStack_40,(ulong)get._4_4_);
      local_50 = Expression::dynCast<wasm::LocalGet>(*ppEVar4);
      if (local_50 == (LocalGet *)0x0) {
        ppEVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                            (pvStack_40,(ulong)get._4_4_);
        local_70 = Expression::dynCast<wasm::LocalSet>(*ppEVar4);
        if (local_70 != (LocalSet *)0x0) {
          this_02 = std::
                    vector<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
                    ::operator[](&this->setsByIndex,(ulong)local_70->index);
          std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::push_back
                    (this_02,&local_70);
        }
      }
      else {
        set = (LocalSet *)actions;
        std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>::
        pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int_&,_true>
                  (&local_60,(FlowBlock **)&set,(uint *)((long)&get + 4));
        this_00 = std::
                  unordered_map<wasm::LocalGet_*,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>_>
                  ::operator[](&this->getLocations,&local_50);
        std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>::operator=(this_00,&local_60);
        this_01 = std::
                  vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                  ::operator[](&this->getsByIndex,(ulong)local_50->index);
        std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::push_back
                  (this_01,&local_50);
      }
    }
    __gnu_cxx::
    __normal_iterator<wasm::LocalGraphFlower::FlowBlock_*,_std::vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void prepareLaziness() {
    prepareFlowBlocks();

    // Set up getLocations, getsByIndex, and setsByIndex.
    auto numLocals = func->getNumLocals();
    getsByIndex.resize(numLocals);
    setsByIndex.resize(numLocals);

    for (auto& block : flowBlocks) {
      const auto& actions = block.actions;
      for (Index i = 0; i < actions.size(); i++) {
        if (auto* get = actions[i]->dynCast<LocalGet>()) {
          getLocations[get] = BlockLocation{&block, i};
          getsByIndex[get->index].push_back(get);
        } else if (auto* set = actions[i]->dynCast<LocalSet>()) {
          setsByIndex[set->index].push_back(set);
        }
      }
    }
  }